

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::create(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint source;
  string name;
  string local_40;
  
  requireDStackAvailable(this,1,"BL");
  this_00 = &this->dStack;
  ForthStack<unsigned_int>::push(this_00,0x20);
  word(this);
  count(this);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  source = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  paVar1 = &local_40.field_2;
  if (uVar2 == 0) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"CREATE: could not parse name","");
    throwCppExceptionMessage(this,&local_40,errorParsedStringOverflow);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
  }
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  assignStringFromCaddress(this,&local_40,source,(ulong)uVar2);
  definePrimitive(this,local_40._M_dataplus._M_p,0x11a164,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void create() {
			alignDataPointer();
			bl();
			word(); 
			count();
			auto length = SIZE_T(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop()); pop();

			RUNTIME_ERROR_IF(length < 1, "CREATE: could not parse name",errorParsedStringOverflow);
			std::string name{};
			assignStringFromCaddress(name, CADDR(caddr), length);
			definePrimitive(name.c_str(), &Forth::doCreate, false);
		}